

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMakeArray
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  unsigned_long uVar4;
  byte bVar5;
  uint uVar6;
  pointer pFVar7;
  pointer pVVar8;
  HeapEntity *pHVar9;
  Identifier *pIVar10;
  HeapObject *pHVar11;
  AST *pAVar12;
  pointer ppHVar13;
  HeapThunk *from;
  _Rb_tree_node_base *p_Var14;
  mapped_type from_00;
  mapped_type *ppHVar15;
  RuntimeError *pRVar16;
  allocator_type *in_RCX;
  long lVar17;
  ulong uVar18;
  LocationRange *__n;
  pointer heap;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *this_01;
  value_type *__val;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *p_Var19;
  pointer ppHVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar25;
  HeapThunk *th;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  elements;
  stringstream ss;
  string local_228;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  local_208;
  HeapEntity *local_1e8;
  BindingFrame *local_1e0;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_1d8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  pFVar7 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8._0_8_ = (mapped_type)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"makeArray","");
  local_228._M_dataplus._M_p = (pointer)0x1100000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_228;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_1d0,__l,in_RCX);
  __n = loc;
  validateBuiltinArgs(this,loc,(string *)local_1b8,args,&local_1d0);
  if (local_1d0.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    __n = (LocationRange *)
          ((long)local_1d0.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)local_1d0.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_1d0.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
  }
  if ((mapped_type)local_1b8._0_8_ != (mapped_type)(local_1b8 + 0x10)) {
    __n = (LocationRange *)(local_1a8[0]._M_allocated_capacity + 1);
    operator_delete((void *)local_1b8._0_8_,(ulong)__n);
  }
  pVVar8 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this_01 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)(long)(pVVar8->v).d;
  if (-1 < (long)this_01) {
    pHVar9 = pVVar8[1].v.h;
    local_208.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (*(long *)&pHVar9[5].mark - (long)pHVar9[5]._vptr_HeapEntity != 0x10) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"makeArray function must take 1 param, got: ",0x2b);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
      pRVar16 = (RuntimeError *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      Stack::makeError(pRVar16,&this->stack,loc,&local_228);
      __cxa_throw(pRVar16,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    if (this_01 ==
        (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
         *)0x0) {
      ppHVar13 = (pointer)0x0;
      ppHVar20 = (pointer)0x0;
    }
    else {
      if ((ulong)this_01 >> 0x3c != 0) {
        std::__throw_length_error("vector::_M_default_append");
      }
      ppHVar13 = std::
                 _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 ::_M_allocate(this_01,(size_t)__n);
      *ppHVar13 = (HeapThunk *)0x0;
      if (this_01 !=
          (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)0x1) {
        memset(ppHVar13 + 1,0,(long)this_01 * 8 - 8);
      }
      ppHVar20 = ppHVar13 + (long)this_01;
      this_00 = &(this->heap).entities;
      p_Var2 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
      local_1e8 = pHVar9 + 1;
      p_Var19 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)0x0;
      local_208.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppHVar13;
      local_208.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppHVar20;
      local_208.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppHVar20;
      do {
        pIVar10 = this->idArrayElement;
        pHVar11 = (HeapObject *)pHVar9[4]._vptr_HeapEntity;
        uVar6 = *(uint *)&pHVar9[4].mark;
        pAVar12 = *(AST **)&pHVar9[6].mark;
        local_1d8 = p_Var19;
        from = (HeapThunk *)operator_new(0x70);
        *(undefined2 *)&(from->super_HeapEntity).type = 0;
        (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0023a660;
        from->name = pIVar10;
        p_Var1 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from->self = pHVar11;
        from->offset = uVar6;
        from->body = pAVar12;
        local_1b8._0_8_ = from;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ::push_back(this_00,(value_type *)local_1b8);
        bVar5 = (this->heap).lastMark;
        (from->super_HeapEntity).mark = bVar5;
        lVar17 = (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = lVar17 >> 3;
        (this->heap).numEntities = uVar18;
        if (((this->heap).gcTuneMinObjects < uVar18) &&
           (auVar21._8_4_ = (int)(lVar17 >> 0x23), auVar21._0_8_ = uVar18,
           auVar21._12_4_ = 0x45300000, uVar4 = (this->heap).lastNumEntities,
           auVar22._8_4_ = (int)(uVar4 >> 0x20), auVar22._0_8_ = uVar4, auVar22._12_4_ = 0x45300000,
           ((auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) *
           (this->heap).gcTuneGrowthTrigger <
           (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0))) {
          Heap::markFrom((Heap *)(ulong)bVar5,(HeapEntity *)from);
          Stack::mark((Stack *)(this->stack).stack.
                               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                      (Heap *)(this->stack).stack.
                              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          if (((this->scratch).t & ARRAY) != NULL_TYPE) {
            Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(this->scratch).v.h);
          }
          for (p_Var14 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != p_Var2;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            if (*(HeapEntity **)(*(long *)(p_Var14 + 3) + 0x40) != (HeapEntity *)0x0) {
              Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                             *(HeapEntity **)(*(long *)(p_Var14 + 3) + 0x40));
            }
          }
          for (p_Var14 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != p_Var3;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                           *(HeapEntity **)(p_Var14 + 2));
          }
          Heap::sweep(&this->heap);
        }
        local_228._M_dataplus._M_p = (pointer)from;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back(&pFVar7[-1].thunks,(value_type *)&local_228);
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::operator=(&from->upValues,
                    (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                     *)local_1e8);
        pIVar10 = (Identifier *)*pHVar9[5]._vptr_HeapEntity;
        from_00 = (mapped_type)operator_new(0x70);
        *(undefined2 *)&(from_00->super_HeapEntity).type = 0;
        (from_00->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0023a660;
        from_00->name = pIVar10;
        p_Var1 = &(from_00->upValues)._M_t._M_impl.super__Rb_tree_header;
        (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        *(_Base_ptr *)((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 8)
             = (_Base_ptr)0x0;
        *(_Rb_tree_header **)
         ((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
        *(_Rb_tree_header **)
         ((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
        from_00->body = (AST *)0x0;
        (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from_00->self = (HeapObject *)0x0;
        from_00->offset = 0;
        heap = (pointer)local_1b8;
        local_1b8._0_8_ = from_00;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ::push_back(this_00,(value_type *)heap);
        bVar5 = (this->heap).lastMark;
        (from_00->super_HeapEntity).mark = bVar5;
        lVar17 = (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = lVar17 >> 3;
        (this->heap).numEntities = uVar18;
        if (((this->heap).gcTuneMinObjects < uVar18) &&
           (auVar23._8_4_ = (int)(lVar17 >> 0x23), auVar23._0_8_ = uVar18,
           auVar23._12_4_ = 0x45300000, uVar4 = (this->heap).lastNumEntities,
           auVar24._8_4_ = (int)(uVar4 >> 0x20), auVar24._0_8_ = uVar4, auVar24._12_4_ = 0x45300000,
           ((auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) *
           (this->heap).gcTuneGrowthTrigger <
           (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0))) {
          Heap::markFrom((Heap *)(ulong)bVar5,(HeapEntity *)from_00);
          heap = (this->stack).stack.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          Stack::mark((Stack *)(this->stack).stack.
                               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                               ._M_impl.super__Vector_impl_data._M_start,(Heap *)heap);
          if (((this->scratch).t & ARRAY) != NULL_TYPE) {
            heap = (pointer)(this->scratch).v.h;
            Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
          }
          for (p_Var14 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != p_Var2;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            heap = *(pointer *)(*(long *)(p_Var14 + 3) + 0x40);
            if (heap != (pointer)0x0) {
              Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
            }
          }
          for (p_Var14 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != p_Var3;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            heap = *(pointer *)(p_Var14 + 2);
            Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
          }
          Heap::sweep(&this->heap);
        }
        p_Var19 = local_1d8;
        (from_00->content).t = NUMBER;
        (from_00->content).v.d = (double)(long)local_1d8;
        (from_00->super_HeapEntity).field_0xa = 1;
        from_00->self = (HeapObject *)0x0;
        local_1e0 = &from->upValues;
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)*(_Base_ptr *)
                       ((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 8)
                   ,(_Link_type)heap);
        *(_Base_ptr *)((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 8)
             = (_Base_ptr)0x0;
        *(_Rb_tree_header **)
         ((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
        *(_Rb_tree_header **)
         ((long)&(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
        (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        ppHVar15 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                   ::operator[](local_1e0,(key_type *)pHVar9[5]._vptr_HeapEntity);
        *ppHVar15 = from_00;
        ppHVar13[(long)p_Var19] = from;
        p_Var19 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)((long)&(p_Var19->_M_impl).super__Vector_impl_data._M_start + 1);
      } while (p_Var19 != this_01);
    }
    VVar25 = makeArray(this,&local_208);
    (this->scratch).t = ARRAY;
    (this->scratch).v = VVar25._0_8_;
    if (ppHVar13 != (pointer)0x0) {
      operator_delete(ppHVar13,(long)ppHVar20 - (long)ppHVar13);
    }
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"makeArray requires size >= 0, got ",0x22);
  std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
  pRVar16 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar16,&this->stack,loc,&local_228);
  __cxa_throw(pRVar16,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinMakeArray(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "makeArray", args, {Value::NUMBER, Value::FUNCTION});
        long sz = long(args[0].v.d);
        if (sz < 0) {
            std::stringstream ss;
            ss << "makeArray requires size >= 0, got " << sz;
            throw makeError(loc, ss.str());
        }
        auto *func = static_cast<const HeapClosure *>(args[1].v.h);
        std::vector<HeapThunk *> elements;
        if (func->params.size() != 1) {
            std::stringstream ss;
            ss << "makeArray function must take 1 param, got: " << func->params.size();
            throw makeError(loc, ss.str());
        }
        elements.resize(sz);
        for (long i = 0; i < sz; ++i) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, func->self, func->offset, func->body);
            // The next line stops the new thunks from being GCed.
            f.thunks.push_back(th);
            th->upValues = func->upValues;

            auto *el = makeHeap<HeapThunk>(func->params[0].id, nullptr, 0, nullptr);
            el->fill(makeNumber(i));  // i guaranteed not to be inf/NaN
            th->upValues[func->params[0].id] = el;
            elements[i] = th;
        }
        scratch = makeArray(elements);
        return nullptr;
    }